

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_cube__size
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *additionalText;
  bool bVar2;
  uint32 uVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  undefined *puVar5;
  xmlChar *text;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar4 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,8);
  pbVar4[0] = 0;
  pbVar4[1] = 0;
  pbVar4[2] = 0;
  pbVar4[3] = 0;
  pbVar4[4] = 0;
  pbVar4[5] = 0;
  pbVar4[6] = 0;
  pbVar4[7] = 0;
  *attributeDataPtr = pbVar4;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    do {
      puVar5 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar1[1];
      if (puVar5 == &DAT_007dfba8) {
        uVar3 = GeneratedSaxParser::Utils::toUint32(additionalText,(bool *)((long)&uStack_38 + 7));
        *(uint32 *)(pbVar4 + 4) = uVar3;
        if (uStack_38._7_1_ == 1) {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x7a105,0x7dfba8,additionalText);
          if (bVar2) {
            return false;
          }
        }
        if ((uStack_38._7_1_ & 1) == 0) {
          *pbVar4 = *pbVar4 | 1;
        }
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x7a105,text,additionalText);
        if (bVar2) {
          return false;
        }
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
    if ((*pbVar4 & 1) != 0) {
      return true;
    }
  }
  bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                     ERROR_REQUIRED_ATTRIBUTE_MISSING,0x7a105,0x7dfba8,(ParserChar *)0x0);
  if (!bVar2) {
    return true;
  }
  return false;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_cube__size( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_cube__size( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_cube__size__AttributeData* attributeData = newData<create_cube__size__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_WIDTH:
    {
bool failed;
attributeData->width = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SIZE,
        HASH_ATTRIBUTE_WIDTH,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_cube__size__AttributeData::ATTRIBUTE_WIDTH_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SIZE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & create_cube__size__AttributeData::ATTRIBUTE_WIDTH_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SIZE, HASH_ATTRIBUTE_WIDTH, 0 ) )
        return false;
}


    return true;
}